

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

bool ON_XMLNodePrivate::GetNextTag(ON_wString *tag,wchar_t **pBuffer,bool bValidateTag)

{
  bool bVar1;
  wchar_t *pwVar2;
  wchar_t *wsz;
  int numChars;
  
  wsz = *pBuffer;
  while( true ) {
    if (*wsz == L'\0') {
      return false;
    }
    if (*wsz == L'<') break;
    wsz = wsz + 1;
  }
  while (wsz[1] == L'?') {
    for (; (*wsz != L'?' || (wsz[1] != L'>')); wsz = wsz + 1) {
      if (*wsz == L'\0') {
        return false;
      }
    }
    wsz = wsz + -1;
    do {
      pwVar2 = wsz + 1;
      wsz = wsz + 1;
    } while (*pwVar2 != L'<');
  }
  while (((wsz[1] == L'!' && (wsz[2] == L'-')) && (wsz[3] == L'-'))) {
    pwVar2 = wsz;
    wsz = wsz + -1;
    for (; ((*pwVar2 != L'-' || (pwVar2[1] != L'-')) || (pwVar2[2] != L'>')); pwVar2 = pwVar2 + 1) {
      if (*pwVar2 == L'\0') {
        return false;
      }
      wsz = wsz + 1;
    }
    do {
      pwVar2 = wsz + 1;
      wsz = wsz + 1;
    } while (*pwVar2 != L'<');
  }
  numChars = 1;
  pwVar2 = wsz;
  while( true ) {
    if (*pwVar2 == L'\0') {
      return false;
    }
    if (*pwVar2 == L'>') break;
    numChars = numChars + 1;
    pwVar2 = pwVar2 + 1;
  }
  *pBuffer = pwVar2 + 1;
  if (numChars < 2) {
    return 1 < numChars;
  }
  ON_wString::Set(tag,wsz,numChars);
  if (!bValidateTag) {
    return true;
  }
  bVar1 = AssertValidTag(tag);
  if (!bVar1) {
    AttemptToFixTag(tag);
    AssertValidTag(tag);
    return true;
  }
  return true;
}

Assistant:

bool ON_XMLNodePrivate::GetNextTag(ON_wString& tag, wchar_t*& pBuffer, bool bValidateTag) // Static.
{
  auto* start = pBuffer;
  while (*start != L'<')
  {
    if (0 == *start)
    {
      OUTPUT_DEBUG_STRING_EOL(L"Start of tag '<' not found");
      return false;
    }

    start++;
  }

  while (start[1] == L'?')
  {
    // This is a nasty document description tag - need to look for the end tag and skip it.
    while (!(start[0] == L'?' && start[1] == L'>'))
    {
      if (0 == *start)
      {
        OUTPUT_DEBUG_STRING_EOL(L"End of document description tag '>' not found");
        return false;
      }

      start++;
    }

    while (*start != L'<')
    {
      start++;
    }
  }

  while ((start[1] == L'!') && (start[2] == L'-') && (start[3] == L'-'))
  {
    // This is a comment tag - need to look for the end tag and skip it.
    while (!(start[0] == L'-' && start[1] == L'-' && start[2] == L'>'))
    {
      if (0 == *start)
      {
        OUTPUT_DEBUG_STRING_EOL(L"End of comment tag '>' not found");
        return false;
      }

      start++;
    }

    while (*start != L'<')
    {
      start++;
    }
  }

  wchar_t* pEnd = start;
  while (*pEnd != L'>')
  {
    if (0 == *pEnd)
    {
      OUTPUT_DEBUG_STRING_EOL(L"End of tag '>' not found");
      return false;
    }

    pEnd++;
  }

  pBuffer = pEnd + 1;

  // Copy the tag into the ready-made string.
  const auto numChars = int(pEnd - start + 1);
  if (numChars < 2)
    return false;

  tag.Set(start, numChars);

  if (bValidateTag)
  {
    if (!AssertValidTag(tag))
    {
      AttemptToFixTag(tag);
      AssertValidTag(tag);
    }
  }

  return true;
}